

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::get(ArrayJoinPromiseNodeBase *this,ExceptionOrValue *output)

{
  char cVar1;
  size_t sVar2;
  Branch *pBVar3;
  long *plVar4;
  char *pcVar5;
  Exception *other;
  long lVar6;
  
  sVar2 = (this->branches).size_;
  if (sVar2 != 0) {
    pBVar3 = (this->branches).ptr;
    lVar6 = 0;
    do {
      if (this->joinBehavior == LAZY) {
        plVar4 = *(long **)((long)&(pBVar3->dependency).ptr + lVar6);
        (**(code **)(*plVar4 + 0x18))(plVar4,*(undefined8 *)((long)&pBVar3->output + lVar6));
      }
      pcVar5 = *(char **)((long)&pBVar3->output + lVar6);
      cVar1 = *pcVar5;
      other = (Exception *)(pcVar5 + 8);
      if (cVar1 == '\0') {
        other = (Exception *)0x0;
      }
      if ((cVar1 == '\x01') && ((output->exception).ptr.isSet == false)) {
        Exception::Exception(&(output->exception).ptr.field_1.value,other);
        (output->exception).ptr.isSet = true;
      }
      lVar6 = lVar6 + 0x58;
    } while (sVar2 * 0x58 - lVar6 != 0);
  }
  if ((output->exception).ptr.isSet != false) {
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,output);
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  for (auto& branch: branches) {
    if (joinBehavior == ArrayJoinBehavior::LAZY) {
      // This implements `joinPromises()`'s lazy evaluation semantics.
      branch.dependency->get(branch.output);
    }

    // If any of the elements threw exceptions, propagate them.
    KJ_IF_SOME(exception, branch.output.exception) {
      output.addException(kj::mv(exception));
    }
  }

  // We either failed fast, or waited for all promises.
  KJ_DASSERT(countLeft == 0 || output.exception != kj::none);

  if (output.exception == kj::none) {
    // No errors.  The template subclass will need to fill in the result.
    getNoError(output);
  }
}